

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjWeakRefLookupTable::mark_undo_ref(CVmObjWeakRefLookupTable *this,CVmUndoRecord *undo_rec)

{
  CVmObjGlobPage *pCVar1;
  CVmObjTable *in_RSI;
  lookuptab_undo_rec *rec;
  
  pCVar1 = in_RSI->globals_;
  if ((int)pCVar1->used_ == 5) {
    CVmObjTable::mark_all_refs(in_RSI,(vm_obj_id_t)((ulong)pCVar1 >> 0x20),(uint)pCVar1);
  }
  return;
}

Assistant:

void CVmObjWeakRefLookupTable::
   mark_undo_ref(VMG_ struct CVmUndoRecord *undo_rec)
{
    lookuptab_undo_rec *rec;

    /* get our private record from the standard undo record */
    rec = (lookuptab_undo_rec *)undo_rec->id.ptrval;

    /* if the key in the record is an object, mark it referenced */
    if (rec->key.typ == VM_OBJ)
        G_obj_table->mark_all_refs(rec->key.val.obj, VMOBJ_REACHABLE);
}